

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int pager_extract_header(Pager *pPager,uchar *zRaw,sxu32 nByte)

{
  sxi32 sVar1;
  void *pvVar2;
  char *zKv;
  sxu32 local_38;
  sxu32 sStack_34;
  sxu16 nLen;
  sxu32 iMagic;
  sxu32 nDos;
  uchar *zEnd;
  uchar *puStack_20;
  sxu32 nByte_local;
  uchar *zRaw_local;
  Pager *pPager_local;
  
  _iMagic = zRaw + nByte;
  zEnd._4_4_ = nByte;
  puStack_20 = zRaw;
  zRaw_local = (uchar *)pPager;
  sVar1 = SyMemcmp("unqlite",zRaw,7);
  if (sVar1 == 0) {
    puStack_20 = puStack_20 + 7;
    SyBigEndianUnpack32(puStack_20,&local_38);
    puStack_20 = puStack_20 + 4;
    if (local_38 == 0xdb7c2712) {
      SyBigEndianUnpack32(puStack_20,&stack0xffffffffffffffcc);
      puStack_20 = puStack_20 + 4;
      SyDosTimeFormat(sStack_34,(Sytm *)(zRaw_local + 0x1a8));
      SyBigEndianUnpack32(puStack_20,(sxu32 *)(zRaw_local + 0x20c));
      puStack_20 = puStack_20 + 4;
      SyBigEndianUnpack32(puStack_20,(sxu32 *)(zRaw_local + 0x208));
      puStack_20 = puStack_20 + 4;
      if ((((*(int *)(zRaw_local + 0x208) < 0x200) || (*(int *)(zRaw_local + 0x20c) < 0x20)) ||
          (0x10000 < *(int *)(zRaw_local + 0x208))) ||
         (((0x10000 < *(int *)(zRaw_local + 0x20c) ||
           (((uint)(*(int *)(zRaw_local + 0x208) < -1) & *(uint *)(zRaw_local + 0x208)) != 0)) ||
          ((*(int *)(zRaw_local + 0x20c) - 1U & *(uint *)(zRaw_local + 0x20c)) != 0)))) {
        pPager_local._4_4_ = -0x18;
      }
      else {
        SyBigEndianUnpack16(puStack_20,(sxu16 *)((long)&zKv + 6));
        puStack_20 = puStack_20 + 2;
        if ((ushort)((short)_iMagic - (short)puStack_20) < zKv._6_2_) {
          zKv._6_2_ = (short)_iMagic - (short)puStack_20;
        }
        pvVar2 = SyMemBackendDup(*(SyMemBackend **)zRaw_local,puStack_20,(uint)zKv._6_2_);
        if (pvVar2 == (void *)0x0) {
          pPager_local._4_4_ = -1;
        }
        else {
          *(void **)(zRaw_local + 0x1e0) = pvVar2;
          *(uint *)(zRaw_local + 0x1e8) = (uint)zKv._6_2_;
          pPager_local._4_4_ = 0;
        }
      }
    }
    else {
      pPager_local._4_4_ = -0x18;
    }
  }
  else {
    pPager_local._4_4_ = -0x18;
  }
  return pPager_local._4_4_;
}

Assistant:

static int pager_extract_header(Pager *pPager,const unsigned char *zRaw,sxu32 nByte)
{
	const unsigned char *zEnd = &zRaw[nByte];
	sxu32 nDos,iMagic;
	sxu16 nLen;
	char *zKv;
	/* Database signature */
	if( SyMemcmp(UNQLITE_DB_SIG,zRaw,sizeof(UNQLITE_DB_SIG)-1) != 0 ){
		/* Corrupt database */
		return UNQLITE_CORRUPT;
	}
	zRaw += sizeof(UNQLITE_DB_SIG)-1;
	/* Database magic number */
	SyBigEndianUnpack32(zRaw,&iMagic);
	zRaw += 4; /* 4 byte magic number */
	if( iMagic != UNQLITE_DB_MAGIC ){
		/* Corrupt database */
		return UNQLITE_CORRUPT;
	}
	/* Database creation time */
	SyBigEndianUnpack32(zRaw,&nDos);
	zRaw += 4; /* 4 byte DOS time format */
	SyDosTimeFormat(nDos,&pPager->tmCreate);
	/* Sector size */
	SyBigEndianUnpack32(zRaw,(sxu32 *)&pPager->iSectorSize);
	zRaw += 4; /* 4 byte sector size */
	/* Page size */
	SyBigEndianUnpack32(zRaw,(sxu32 *)&pPager->iPageSize);
	zRaw += 4; /* 4 byte page size */
	/* Check that the values read from the page-size and sector-size fields
    ** are within range. To be 'in range', both values need to be a power
    ** of two greater than or equal to 512 or 32, and not greater than their 
    ** respective compile time maximum limits.
    */
    if( pPager->iPageSize<UNQLITE_MIN_PAGE_SIZE || pPager->iSectorSize<32
     || pPager->iPageSize>UNQLITE_MAX_PAGE_SIZE || pPager->iSectorSize>MAX_SECTOR_SIZE
     || ((pPager->iPageSize<-1)&pPager->iPageSize)!=0    || ((pPager->iSectorSize-1)&pPager->iSectorSize)!=0 
    ){
      return UNQLITE_CORRUPT;
	}
	/* Key value storage engine */
	SyBigEndianUnpack16(zRaw,&nLen); /* 2 byte storage engine length */
	zRaw += 2;
	if( nLen > (sxu16)(zEnd - zRaw) ){
		nLen = (sxu16)(zEnd - zRaw);
	}
	zKv = (char *)SyMemBackendDup(pPager->pAllocator,(const char *)zRaw,nLen);
	if( zKv == 0 ){
		return UNQLITE_NOMEM;
	}
	SyStringInitFromBuf(&pPager->sKv,zKv,nLen);
	return UNQLITE_OK;
}